

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  uint64_t uVar5;
  long *plVar6;
  undefined1 *puVar7;
  size_type *psVar8;
  long lVar9;
  Result *_result;
  string err;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,2,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (layer->_oneof_case_[0] == 0x3cf) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_SplitNDLayerParams_default_instance_;
  }
  uVar5 = (uint64_t)(((ConvolutionLayerParams *)puVar7)->kernelsize_).current_size_;
  if (((long)uVar5 < 1) && (uVar5 = ((BatchnormLayerParams *)puVar7)->channels_, uVar5 == 0)) {
    std::operator+(&local_38,"Either split_sizes or num_splits should be provided for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58.field_2._8_8_ = plVar6[3];
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_58._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
  }
  else {
    if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
      lVar3 = ((SplitNDLayerParams *)puVar7)->axis_;
      lVar9 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                   [0] + 0x24);
      if ((SBORROW8(lVar3,-lVar9) != lVar3 + lVar9 < 0) || (lVar9 <= lVar3)) {
        std::operator+(&local_38,
                       "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_58.field_2._M_allocated_capacity = *psVar8;
          local_58.field_2._8_8_ = plVar6[3];
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar8;
          local_58._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_58._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
        goto LAB_0034c8d7;
      }
    }
    if (uVar5 == (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_38,"Value of num_splits should match size of output names for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58.field_2._8_8_ = plVar6[3];
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_58._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
  }
LAB_0034c8d7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitNDLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    size_t numSplits = 0;
    const auto& params = layer.splitnd();

    if (params.splitsizes_size() > 0) {
        numSplits = static_cast<size_t>(params.splitsizes_size());
    } else {
        numSplits = static_cast<size_t>(params.numsplits());
    }
    if (numSplits == 0) {
        const std::string err = "Either split_sizes or num_splits should be provided for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    if (numSplits != static_cast<size_t>(layer.output_size())) {
        const std::string err = "Value of num_splits should match size of output names for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}